

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O1

void __thiscall slang::TimeTrace::Profiler::end(Profiler *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    end();
  }
  lVar1 = *in_FS_OFFSET;
  lVar2 = in_FS_OFFSET[-3];
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar4 = lVar4 - *(long *)(lVar2 + -0x58);
  *(long *)(lVar2 + -0x50) = lVar4;
  if (0x7a507 < lVar4) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mut);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    std::vector<slang::Entry,_std::allocator<slang::Entry>_>::emplace_back<slang::Entry>
              (&this->entries,(Entry *)(lVar2 + -0x58));
    pthread_mutex_unlock((pthread_mutex_t *)&this->mut);
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    end();
  }
  lVar2 = in_FS_OFFSET[-3];
  in_FS_OFFSET[-3] = lVar2 + -0x58;
  std::allocator_traits<std::allocator<slang::Entry>_>::destroy<slang::Entry>
            ((allocator_type *)(lVar1 + -0x20),(Entry *)(lVar2 + -0x58));
  return;
}

Assistant:

void end() {
        SLANG_ASSERT(!stack.empty());
        SLANG_ASSERT(stack.back().threadId == std::this_thread::get_id());

        auto&& entry = stack.back();
        entry.duration = steady_clock::now() - entry.start;

        // Only include sections longer than 500us.
        if (duration_cast<microseconds>(entry.duration).count() > 500) {
            std::scoped_lock<std::mutex> lock(mut);
            entries.emplace_back(std::move(entry));
        }

        stack.pop_back();
    }